

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamma.c
# Opt level: O1

void key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  GLFWmonitor *handle;
  float fVar1;
  
  if (action != 1) {
    return;
  }
  if (key < 0x108) {
    if (key == 0x51) goto LAB_00110e96;
    if (key != 0x57) {
      if (key != 0x100) {
        return;
      }
      glfwSetWindowShouldClose(window,1);
      return;
    }
  }
  else if (key < 0x14d) {
    if (key != 0x108) {
      if (key != 0x109) {
        return;
      }
LAB_00110e96:
      set_gamma(window,gamma_value + 0.1);
      return;
    }
  }
  else if (key != 0x14d) {
    if (key != 0x14e) {
      return;
    }
    goto LAB_00110e96;
  }
  fVar1 = gamma_value + -0.1;
  if (fVar1 <= 0.0) {
    return;
  }
  handle = glfwGetWindowMonitor(window);
  if (handle == (GLFWmonitor *)0x0) {
    handle = glfwGetPrimaryMonitor();
  }
  gamma_value = fVar1;
  printf("Gamma: %f\n",(double)fVar1);
  glfwSetGamma(handle,gamma_value);
  return;
}

Assistant:

static void key_callback(GLFWwindow* window, int key, int scancode, int action, int mods)
{
    if (action != GLFW_PRESS)
        return;

    switch (key)
    {
        case GLFW_KEY_ESCAPE:
        {
            glfwSetWindowShouldClose(window, GLFW_TRUE);
            break;
        }

        case GLFW_KEY_KP_ADD:
        case GLFW_KEY_UP:
        case GLFW_KEY_Q:
        {
            set_gamma(window, gamma_value + STEP_SIZE);
            break;
        }

        case GLFW_KEY_KP_SUBTRACT:
        case GLFW_KEY_DOWN:
        case GLFW_KEY_W:
        {
            if (gamma_value - STEP_SIZE > 0.f)
                set_gamma(window, gamma_value - STEP_SIZE);

            break;
        }
    }
}